

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O1

void (anonymous_namespace)::
     assertEmpty<slang::SmallVector<(anonymous_namespace)::Constructable,9ul>>
               (SmallVector<(anonymous_namespace)::Constructable,_9UL> *v)

{
  size_type sVar1;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  AssertionHandler catchAssertionHandler;
  AssertionHandler local_c0;
  pointer local_78;
  pointer local_70;
  ITransientExpression local_68;
  pointer *local_58;
  char *local_50;
  size_type local_48;
  pointer *local_40;
  ITransientExpression local_38;
  
  local_68._vptr_ITransientExpression = (_func_int **)0xa29410;
  local_68.m_isBinaryExpression = true;
  local_68.m_result = false;
  local_68._10_6_ = 0;
  capturedExpression.m_size = 0xe;
  capturedExpression.m_start = "0u == v.size()";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_c0,macroName,(SourceLineInfo *)&local_68,capturedExpression,ContinueOnFailure);
  local_48 = (v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len;
  local_68.m_result = local_48 == 0;
  local_68.m_isBinaryExpression = true;
  local_68._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00cbba38;
  local_68._8_8_ = local_68._8_8_ & 0xffffffff;
  local_58 = (pointer *)0xa5f463;
  local_50 = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&local_c0,&local_68);
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_68._vptr_ITransientExpression = (_func_int **)0xa29410;
  local_68.m_isBinaryExpression = true;
  local_68.m_result = false;
  local_68._10_6_ = 0;
  capturedExpression_00.m_size = 9;
  capturedExpression_00.m_start = "v.empty()";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_c0,macroName_00,(SourceLineInfo *)&local_68,capturedExpression_00,
             ContinueOnFailure);
  local_38.m_result = (v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len == 0;
  local_38.m_isBinaryExpression = false;
  local_38._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00cb35e0;
  local_38._10_1_ = local_38.m_result;
  Catch::AssertionHandler::handleExpr(&local_c0,&local_38);
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_68._vptr_ITransientExpression = (_func_int **)0xa29410;
  local_68.m_isBinaryExpression = true;
  local_68.m_result = false;
  local_68._10_6_ = 0;
  capturedExpression_01.m_size = 0x14;
  capturedExpression_01.m_start = "v.begin() == v.end()";
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_c0,macroName_01,(SourceLineInfo *)&local_68,capturedExpression_01,
             ContinueOnFailure);
  local_70 = (v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).data_;
  local_58 = &local_70;
  sVar1 = (v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len;
  local_78 = local_70 + sVar1;
  local_68.m_result = sVar1 == 0;
  local_68.m_isBinaryExpression = true;
  local_40 = &local_78;
  local_68._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00cb78e8;
  local_50 = "==";
  local_48 = 2;
  Catch::AssertionHandler::handleExpr(&local_c0,&local_68);
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return;
}

Assistant:

void assertEmpty(TVector& v) {
    CHECK(0u == v.size());
    CHECK(v.empty());
    CHECK(v.begin() == v.end());
}